

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

bool __thiscall
GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::Reduce(MI<6UL,_GF2::MOGrevlex<6UL>_> *this,iterator pos)

{
  _List_node_base *polyRight;
  bool bVar1;
  bool bVar2;
  int iVar3;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *pMVar4;
  _List_node_base *p_Var5;
  MM<6UL> lm;
  MP<6UL,_GF2::MOGrevlex<6UL>_> poly;
  Geobucket<2UL> gb;
  MM<6UL> local_90;
  _List_node_base *local_88;
  MP<6UL,_GF2::MOGrevlex<6UL>_> local_80;
  Geobucket<2UL> local_60;
  
  p_Var5 = pos._M_node + 1;
  MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::Geobucket
            (&local_60,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)p_Var5);
  local_88 = p_Var5;
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
            ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)p_Var5);
  local_90.super_WW<6UL>._words[0] = (WW<6UL>)(word  [1])0x0;
  local_80.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_80;
  local_80.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node._M_size = 0;
  bVar2 = false;
  local_80.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_80.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
       super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  do {
    bVar1 = MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::PopLM(&local_60,&local_90);
    p_Var5 = (_List_node_base *)this;
    if (!bVar1) {
      std::__cxx11::_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::_M_clear
                ((_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&local_80);
      MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::~Geobucket(&local_60);
      return bVar2;
    }
    do {
      do {
        p_Var5 = p_Var5->_M_next;
        if (p_Var5 == (_List_node_base *)this) goto LAB_0013fd1b;
      } while (p_Var5 == pos._M_node);
      iVar3 = MOGrevlex<6UL>::Compare
                        ((MOGrevlex<6UL> *)&this->field_0x18,(MM<6UL> *)(p_Var5[1]._M_next + 1),
                         &local_90);
      if (0 < iVar3) goto LAB_0013fd1b;
      polyRight = p_Var5 + 1;
    } while (((ulong)(((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&polyRight->_M_next)->
                     super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node
                     .super__List_node_base._M_next[1]._M_next &
             ~(ulong)local_90.super_WW<6UL>._words[0]) != 0);
    pMVar4 = MP<6UL,_GF2::MOGrevlex<6UL>_>::operator=
                       (&local_80,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)polyRight);
    std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::pop_front
              (&pMVar4->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>);
    local_90.super_WW<6UL>._words[0] =
         (WW<6UL>)((ulong)local_90.super_WW<6UL>._words[0] &
                  ~(ulong)(((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)
                           &polyRight->_M_next)->
                          super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl.
                          _M_node.super__List_node_base._M_next[1]._M_next);
    pMVar4 = MP<6UL,_GF2::MOGrevlex<6UL>_>::operator*=(&local_80,&local_90);
    MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::SymDiffSplice(&local_60,pMVar4);
    bVar2 = true;
    if (p_Var5 == (_List_node_base *)this) {
LAB_0013fd1b:
      std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::push_back
                ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)local_88,&local_90);
    }
  } while( true );
}

Assistant:

bool Reduce(iterator pos)
	{	
		typename MP<_n, _O>::template Geobucket<2> gb(*pos);
		// будем сохранять в *pos остаток
		pos->SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP<_n, _O> poly(_order);
		while (gb.PopLM(lm))
		{
			iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// пропускаем многочлен в позиции pos
				if (iterPoly == pos) continue;
				// все остальное без изменений
				if (_order.Compare(iterPoly->LM(), lm) > 0)
				{
					iterPoly = end();
					break;
				}
				else if (iterPoly->LM() | lm)
				{
					changed = true;
					(poly = *iterPoly).PopLM();
					gb.SymDiffSplice(poly *= (lm /= iterPoly->LM()));
					break;
				}
			}
			if (iterPoly == end()) pos->push_back(lm);
		}
		return changed;
	}